

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

PaddingLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_padding(NeuralNetworkLayer *this)

{
  PaddingLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 200) {
    clear_layer(this);
    this->_oneof_case_[0] = 200;
    this_00 = (PaddingLayerParams *)operator_new(0x28);
    PaddingLayerParams::PaddingLayerParams(this_00);
    (this->layer_).padding_ = this_00;
  }
  return (PaddingLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::PaddingLayerParams* NeuralNetworkLayer::mutable_padding() {
  if (!has_padding()) {
    clear_layer();
    set_has_padding();
    layer_.padding_ = new ::CoreML::Specification::PaddingLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.padding)
  return layer_.padding_;
}